

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::FillStaticLayerParams::ByteSizeLong(FillStaticLayerParams *this)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  int index;
  
  iVar2 = (this->targetshape_).current_size_;
  index = 0;
  if (iVar2 < 1) {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    do {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->targetshape_,index);
      lVar3 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      lVar8 = lVar8 + (ulong)((int)lVar3 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar2 != index);
  }
  uVar7 = (uint)lVar8;
  if (lVar8 == 0) {
    uVar6 = 0;
  }
  else if ((int)uVar7 < 0) {
    uVar6 = 0xb;
  }
  else {
    iVar2 = 0x1f;
    if ((uVar7 | 1) != 0) {
      for (; (uVar7 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar6 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
  }
  this->_targetshape_cached_byte_size_ = uVar7;
  sVar1 = uVar6 + 5 + lVar8;
  sVar5 = uVar6 + lVar8;
  if (this->value_ != 0.0) {
    sVar5 = sVar1;
  }
  if (NAN(this->value_)) {
    sVar5 = sVar1;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t FillStaticLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.FillStaticLayerParams)
  size_t total_size = 0;

  // repeated uint64 targetShape = 2;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->targetshape_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _targetshape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // float value = 1;
  if (this->value() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}